

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pubkey.cpp
# Opt level: O0

void __thiscall Pubkey_ConstructorTest_Test::TestBody(Pubkey_ConstructorTest_Test *this)

{
  anon_struct_40_4_6b391b1b *this_00;
  bool bVar1;
  reference paVar2;
  char *pcVar3;
  char *in_R9;
  string local_1b8;
  AssertHelper local_198;
  Message local_190;
  bool local_181;
  undefined1 local_180 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_150;
  Message local_148;
  bool local_139;
  undefined1 local_138 [8];
  AssertionResult gtest_ar_;
  Pubkey local_100;
  ByteData local_e8;
  Pubkey local_d0;
  anon_struct_40_4_6b391b1b local_b8;
  Pubkey local_90;
  undefined1 local_68 [8];
  Pubkey pubkey;
  PubkeyTestVector test_vector;
  const_iterator __end1;
  const_iterator __begin1;
  vector<PubkeyTestVector,_std::allocator<PubkeyTestVector>_> *__range1;
  Pubkey_ConstructorTest_Test *this_local;
  
  __end1 = std::vector<PubkeyTestVector,_std::allocator<PubkeyTestVector>_>::begin
                     (&pubkey_test_vectors);
  test_vector._32_8_ =
       std::vector<PubkeyTestVector,_std::allocator<PubkeyTestVector>_>::end(&pubkey_test_vectors);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_PubkeyTestVector_*,_std::vector<PubkeyTestVector,_std::allocator<PubkeyTestVector>_>_>
                                     *)&test_vector.expect_invalid), bVar1) {
    paVar2 = __gnu_cxx::
             __normal_iterator<const_PubkeyTestVector_*,_std::vector<PubkeyTestVector,_std::allocator<PubkeyTestVector>_>_>
             ::operator*(&__end1);
    this_00 = (anon_struct_40_4_6b391b1b *)
              &pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    anon_struct_40_4_6b391b1b::PubkeyTestVector(this_00,paVar2);
    cfd::core::Pubkey::Pubkey((Pubkey *)local_68,(string *)this_00);
    cfd::core::Pubkey::Pubkey(&local_90,(Pubkey *)local_68);
    anon_struct_40_4_6b391b1b::PubkeyTestVector
              (&local_b8,
               (anon_struct_40_4_6b391b1b *)
               &pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pubkeyFieldTest(&local_90,&local_b8);
    anon_struct_40_4_6b391b1b::~PubkeyTestVector(&local_b8);
    cfd::core::Pubkey::~Pubkey(&local_90);
    cfd::core::ByteData::ByteData
              (&local_e8,
               (string *)
               &pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cfd::core::Pubkey::Pubkey(&local_d0,&local_e8);
    cfd::core::Pubkey::operator=((Pubkey *)local_68,&local_d0);
    cfd::core::Pubkey::~Pubkey(&local_d0);
    cfd::core::ByteData::~ByteData(&local_e8);
    cfd::core::Pubkey::Pubkey(&local_100,(Pubkey *)local_68);
    anon_struct_40_4_6b391b1b::PubkeyTestVector
              ((anon_struct_40_4_6b391b1b *)&gtest_ar_.message_,
               (anon_struct_40_4_6b391b1b *)
               &pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pubkeyFieldTest(&local_100,(PubkeyTestVector *)&gtest_ar_.message_);
    anon_struct_40_4_6b391b1b::~PubkeyTestVector((anon_struct_40_4_6b391b1b *)&gtest_ar_.message_);
    cfd::core::Pubkey::~Pubkey(&local_100);
    if ((test_vector.hex.field_2._M_local_buf[10] & 1U) == 0) {
      bVar1 = cfd::core::Pubkey::IsParity((Pubkey *)local_68);
      local_181 = (bool)(~bVar1 & 1);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_180,&local_181,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
      if (!bVar1) {
        testing::Message::Message(&local_190);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_1b8,(internal *)local_180,(AssertionResult *)"pubkey.IsParity()","true",
                   "false",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_198,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_pubkey.cpp"
                   ,0x5c,pcVar3);
        testing::internal::AssertHelper::operator=(&local_198,&local_190);
        testing::internal::AssertHelper::~AssertHelper(&local_198);
        std::__cxx11::string::~string((string *)&local_1b8);
        testing::Message::~Message(&local_190);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
    }
    else {
      local_139 = cfd::core::Pubkey::IsParity((Pubkey *)local_68);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_138,&local_139,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
      if (!bVar1) {
        testing::Message::Message(&local_148);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__1.message_,(internal *)local_138,
                   (AssertionResult *)"pubkey.IsParity()","false","true",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_150,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_pubkey.cpp"
                   ,0x5a,pcVar3);
        testing::internal::AssertHelper::operator=(&local_150,&local_148);
        testing::internal::AssertHelper::~AssertHelper(&local_150);
        std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
        testing::Message::~Message(&local_148);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
    }
    cfd::core::Pubkey::~Pubkey((Pubkey *)local_68);
    anon_struct_40_4_6b391b1b::~PubkeyTestVector
              ((anon_struct_40_4_6b391b1b *)
               &pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::
    __normal_iterator<const_PubkeyTestVector_*,_std::vector<PubkeyTestVector,_std::allocator<PubkeyTestVector>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

TEST(Pubkey, ConstructorTest) {
  for (PubkeyTestVector test_vector : pubkey_test_vectors) {
    // hex string constructor
    Pubkey pubkey = Pubkey(test_vector.hex);
    pubkeyFieldTest(pubkey, test_vector);
    // ByteData constructor
    pubkey = Pubkey(ByteData(test_vector.hex));
    pubkeyFieldTest(pubkey, test_vector);
    if (test_vector.parity) {
      EXPECT_TRUE(pubkey.IsParity());
    } else {
      EXPECT_FALSE(pubkey.IsParity());
    }
  }
}